

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

uchar * extra_next_record(ctl_extr_rec *ctl,int length)

{
  isoent *piVar1;
  extr_rec **ppeVar2;
  anon_struct_24_3_5afa785c_for_extr_rec_list *paVar3;
  extr_rec *peVar4;
  uint uVar5;
  anon_struct_24_3_5afa785c_for_extr_rec_list *paVar6;
  int iVar7;
  
  iVar7 = ctl->cur_len;
  extra_close_record(ctl,0x1c);
  ctl->use_extr = 1;
  if (ctl->bp != (uchar *)0x0) {
    ctl->ce_ptr = ctl->bp + (long)iVar7 + 1;
    piVar1 = ctl->isoent->parent;
    peVar4 = (piVar1->extr_rec_list).current;
    iVar7 = peVar4->offset;
    if (0x7e4 < iVar7) {
      peVar4 = peVar4->next;
      iVar7 = peVar4->offset;
    }
    uVar5 = 0x7e3 - iVar7;
    if ((0x7e4U - iVar7 & 1) == 0) {
      uVar5 = 0x7e4U - iVar7;
    }
    ctl->limit = uVar5;
    ctl->extr_off = peVar4->offset;
    ctl->extr_loc = peVar4->location;
    (piVar1->extr_rec_list).current = peVar4;
    ctl->bp = peVar4->buf + (long)peVar4->offset + -1;
    goto LAB_00445cfc;
  }
  piVar1 = ctl->isoent->parent;
  if ((piVar1->extr_rec_list).first == (extr_rec *)0x0) {
LAB_00445c8c:
    peVar4 = (extr_rec *)malloc(0x810);
    if (peVar4 == (extr_rec *)0x0) {
      uVar5 = ctl->limit;
      goto LAB_00445cfc;
    }
    iVar7 = 0;
    *(extr_rec **)peVar4 = (extr_rec *)0x0;
    peVar4->next = (extr_rec *)0x0;
    paVar3 = (anon_struct_24_3_5afa785c_for_extr_rec_list *)(piVar1->extr_rec_list).last;
    paVar6 = &piVar1->extr_rec_list;
    if (paVar3 != (anon_struct_24_3_5afa785c_for_extr_rec_list *)0x0) {
      paVar6 = paVar3;
    }
    paVar6->first = peVar4;
    (piVar1->extr_rec_list).last = &peVar4->next;
  }
  else {
    ppeVar2 = (piVar1->extr_rec_list).last;
    iVar7 = *(int *)((long)ppeVar2 + -0x804);
    if (0x7e4 < iVar7) goto LAB_00445c8c;
    peVar4 = (extr_rec *)(ppeVar2 + -0x101);
  }
  uVar5 = 0x7e3 - iVar7;
  if ((0x7e4U - iVar7 & 1) == 0) {
    uVar5 = 0x7e4U - iVar7;
  }
  ctl->limit = uVar5;
  (piVar1->extr_rec_list).current = peVar4;
LAB_00445cfc:
  ctl->cur_len = 0;
  if ((int)uVar5 < length) {
    extra_next_record(ctl,length);
  }
  return ctl->bp;
}

Assistant:

static unsigned char *
extra_next_record(struct ctl_extr_rec *ctl, int length)
{
	int cur_len = ctl->cur_len;/* save cur_len */

	/* Close the current extra record or Directory Record. */
	extra_close_record(ctl, RR_CE_SIZE);

	/* Get a next extra record. */
	ctl->use_extr = 1;
	if (ctl->bp != NULL) {
		/* Storing data into an extra record. */
		unsigned char *p;

		/* Save the pointer where a CE extension will be
		 * stored to. */
		ctl->ce_ptr = &ctl->bp[cur_len+1];
		p = extra_get_record(ctl->isoent,
		    &ctl->limit, &ctl->extr_off, &ctl->extr_loc);
		ctl->bp = p - 1;/* the base of bp offset is 1. */
	} else
		/* Calculating the size of an extra record. */
		(void)extra_get_record(ctl->isoent,
		    &ctl->limit, NULL, NULL);
	ctl->cur_len = 0;
	/* Check if an extra record is almost full.
	 * If so, get a next one. */
	if (extra_space(ctl) < length)
		(void)extra_next_record(ctl, length);

	return (ctl->bp);
}